

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

bool __thiscall
bssl::Array<unsigned_char>::InitUninitialized(Array<unsigned_char> *this,size_t new_size)

{
  uchar *puVar1;
  size_t new_size_local;
  Array<unsigned_char> *this_local;
  
  Reset(this);
  if (new_size == 0) {
    this_local._7_1_ = true;
  }
  else {
    puVar1 = (uchar *)OPENSSL_malloc(new_size);
    this->data_ = puVar1;
    if (this->data_ == (uchar *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      this->size_ = new_size;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool InitUninitialized(size_t new_size) {
    Reset();
    if (new_size == 0) {
      return true;
    }

    if (new_size > SIZE_MAX / sizeof(T)) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      return false;
    }
    data_ = reinterpret_cast<T *>(OPENSSL_malloc(new_size * sizeof(T)));
    if (data_ == nullptr) {
      return false;
    }
    size_ = new_size;
    return true;
  }